

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask21_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x15 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 0xb;
  *puVar1 = in[2] << 10 | *puVar1;
  *puVar1 = in[3] << 0x1f | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] >> 1;
  *puVar1 = in[4] << 0x14 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] >> 0xc;
  *puVar1 = in[5] << 9 | *puVar1;
  *puVar1 = in[6] << 0x1e | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[6] >> 2;
  *puVar1 = in[7] << 0x13 | *puVar1;
  out[5] = in[7] >> 0xd;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask21_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (21 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (21 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (21 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (21 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (21 - 8);
  ++in;

  return out + 1;
}